

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::LocalsWalker::LocalsWalker(LocalsWalker *this,DiagStackFrame *_frame,DWORD _frameWalkerFlags)

{
  byte bVar1;
  Type TVar2;
  DiagStackFrame *pDVar3;
  code *pcVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  DWORD DVar8;
  int iVar9;
  RegSlot RVar10;
  uint uVar11;
  ScopeType SVar12;
  undefined4 extraout_var;
  FunctionBody *this_00;
  ArenaAllocator *alloc;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar13;
  FrameDisplay *this_01;
  ScopeObjectChain *pSVar14;
  VariableWalkerBase *pVVar15;
  undefined4 extraout_var_02;
  DebuggerScope *pDVar16;
  void *pvVar17;
  undefined4 extraout_var_03;
  undefined4 *puVar18;
  undefined *puVar19;
  undefined4 extraout_var_04;
  void *scope;
  DiagScopeVariablesWalker *this_02;
  undefined **ppuVar20;
  RecyclableObjectWalker *this_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  byte bVar21;
  uint i;
  uint uVar22;
  uint uVar23;
  undefined **local_78;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  (this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
       (_func_int **)&PTR_Get_014e21c0;
  this->pFrame = _frame;
  this->pVarWalkers =
       (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  this->totalLocalsCount = 0;
  this->frameWalkerFlags = _frameWalkerFlags;
  this->hasUserNotDefinedArguments = false;
  iVar7 = (*_frame->_vptr_DiagStackFrame[2])(_frame);
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar7));
  if (this_00 == (FunctionBody *)0x0) {
    return;
  }
  if ((((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->field_0xa8
      & 4) != 0) {
    return;
  }
  iVar7 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
  alloc = (ArenaAllocator *)CONCAT44(extraout_var_00,iVar7);
  uVar23 = 0;
  pLVar13 = (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
  (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  alloc = alloc;
  (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e4420;
  (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = 0;
  pLVar13->length = 0;
  pLVar13->increment = 4;
  this->pVarWalkers = pLVar13;
  iVar7 = (*this->pFrame->_vptr_DiagStackFrame[0xf])();
  this_01 = (FrameDisplay *)CONCAT44(extraout_var_01,iVar7);
  if (this_01 != (FrameDisplay *)0x0) {
    uVar23 = (uint)this_01->length;
  }
  pSVar14 = FunctionBody::GetScopeObjectChain(this_00);
  if (pSVar14 != (ScopeObjectChain *)0x0) {
    pLVar13 = this->pVarWalkers;
    pVVar15 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
    DVar8 = this->frameWalkerFlags;
    pVVar15->pFrame = this->pFrame;
    pVVar15->instance = (Var)0x0;
    pVVar15->pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    pVVar15->groupType = UIGroupType_InnerScope;
    pVVar15->allowLexicalThis = false;
    pVVar15->allowSuperReference = false;
    (pVVar15->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
         (_func_int **)&PTR_Get_014e20e0;
    pVVar15[1].super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase = (_func_int **)0x0
    ;
    *(undefined4 *)&pVVar15[1].pFrame = 0;
    *(undefined1 *)((long)&pVVar15[1].pFrame + 4) = 0;
    *(byte *)((long)&pVVar15[1].pFrame + 5) = (byte)DVar8 >> 1 & 1;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar13,0);
    iVar7 = (pLVar13->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer[iVar7] = pVVar15;
    (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = iVar7 + 1;
  }
  if (((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 0x10) == 0) {
    bVar5 = ((byte)this->frameWalkerFlags & 0x10) >> 4;
    bVar21 = 0;
  }
  else {
    bVar1 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
    bVar21 = bVar1 ^ 1;
    bVar5 = ((byte)this->frameWalkerFlags & 0x10) >> 4;
    if ((bVar1 & 1) == 0 && bVar5 == 0) {
      pLVar13 = this->pVarWalkers;
      pVVar15 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
      pDVar3 = this->pFrame;
      iVar7 = (*pDVar3->_vptr_DiagStackFrame[0x11])(pDVar3);
      pVVar15->pFrame = pDVar3;
      pVVar15->instance = (Var)CONCAT44(extraout_var_02,iVar7);
      pVVar15->pMembersList =
           (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
      bVar5 = 0;
      *(undefined8 *)((long)&pVVar15->pMembersList + 6) = 0;
      (pVVar15->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
           (_func_int **)&PTR_Get_014e2ea0;
      JsUtil::
      List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(pLVar13,0);
      iVar7 = (pLVar13->
              super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
              .count;
      (pLVar13->
      super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer
      [iVar7] = pVVar15;
      (pLVar13->
      super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).count =
           iVar7 + 1;
    }
  }
  pDVar16 = GetScopeWhenHaltAtFormals(this->pFrame);
  DVar8 = GetCurrentFramesLocalsType(this->pFrame);
  if ((pDVar16 == (DebuggerScope *)0x0) ||
     (iVar7 = (pDVar16->range).end, iVar9 = GetAdjustedByteCodeOffset(this->pFrame), iVar7 <= iVar9)
     ) {
LAB_008b02e4:
    if ((DVar8 & 4) == 0) {
      if ((DVar8 & 2) != 0) {
        puVar19 = &SlotArrayVariablesWalker::vtable;
        if (uVar23 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar18 = 1;
          uVar22 = 0x458;
          goto LAB_008b045b;
        }
        goto LAB_008b0473;
      }
      uVar22 = 0;
      if (((uVar23 != 0) && (RVar10 = FunctionBody::GetFrameDisplayRegister(this_00), RVar10 != 0))
         && (uVar22 = 0, (this_00->field_0x17b & 4) != 0)) {
        pvVar17 = FrameDisplay::GetItem(this_01,0);
        iVar7 = (*this->pFrame->_vptr_DiagStackFrame[10])();
        uVar22 = 1;
        if (pvVar17 != *(void **)(*(long *)(CONCAT44(extraout_var_03,iVar7) + 8) + 0x438)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar18 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x45e,
                                      "((Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull())"
                                      ,
                                      "(Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull()"
                                     );
          if (!bVar6) goto LAB_008b09a8;
          *puVar18 = 0;
        }
      }
    }
    else {
      puVar19 = &ObjectVariablesWalker::vtable;
      if (uVar23 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar18 = 1;
        uVar22 = 0x452;
LAB_008b045b:
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,uVar22,"(scopeCount > 0)","scopeCount > 0");
        if (!bVar6) goto LAB_008b09a8;
        *puVar18 = 0;
      }
LAB_008b0473:
      pVVar15 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
      pDVar3 = this->pFrame;
      pvVar17 = FrameDisplay::GetItem(this_01,0);
      bVar1 = (byte)this->frameWalkerFlags;
      pVVar15->pFrame = pDVar3;
      pVVar15->instance = pvVar17;
      pVVar15->pMembersList =
           (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
      pVVar15->groupType = UIGroupType_None;
      pVVar15->allowLexicalThis = (bool)(bVar1 >> 2 & 1);
      pVVar15->allowSuperReference = (bool)(bVar1 >> 3 & 1);
      (pVVar15->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
           (_func_int **)(puVar19 + 0x10);
      pLVar13 = this->pVarWalkers;
      JsUtil::
      List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(pLVar13,0);
      iVar7 = (pLVar13->
              super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
              .count;
      (pLVar13->
      super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer
      [iVar7] = pVVar15;
      (pLVar13->
      super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).count =
           iVar7 + 1;
      uVar22 = 1;
    }
    if (pDVar16 == (DebuggerScope *)0x0) goto LAB_008b065c;
    uVar11 = *(uint *)&this_00->field_0x178;
  }
  else {
    uVar11 = *(uint *)&this_00->field_0x178;
    uVar22 = 0;
    if ((uVar11 >> 0x1a & 1) != 0) goto LAB_008b02e4;
  }
  if ((uVar11 >> 0x1a & 1) == 0) {
    pvVar17 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,PropertyIdOnRegSlotsContainer);
    if (pvVar17 != (void *)0x0) {
      pvVar17 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,PropertyIdOnRegSlotsContainer);
      DVar8 = DVar8 | *(int *)((long)pvVar17 + 0xc) != -1;
    }
    if (uVar23 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar18 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x470,"(scopeCount > 0)","scopeCount > 0");
      if (!bVar6) {
LAB_008b09a8:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar18 = 0;
    }
    TVar2 = pDVar16->scopeType;
    pLVar13 = this->pVarWalkers;
    pVVar15 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
    pDVar3 = this->pFrame;
    pvVar17 = FrameDisplay::GetItem(this_01,uVar22);
    bVar1 = (byte)this->frameWalkerFlags;
    pVVar15->pFrame = pDVar3;
    pVVar15->instance = pvVar17;
    pVVar15->pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    pVVar15->groupType = UIGroupType_Param;
    pVVar15->allowLexicalThis = (bool)(bVar1 >> 2 & 1);
    pVVar15->allowSuperReference = (bool)(bVar1 >> 3 & 1);
    if (TVar2 == DiagParamScopeInObject) {
      puVar19 = &ObjectVariablesWalker::vtable;
    }
    else {
      puVar19 = &SlotArrayVariablesWalker::vtable;
    }
    (pVVar15->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
         (_func_int **)(puVar19 + 0x10);
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar13,0);
    iVar7 = (pLVar13->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer[iVar7] = pVVar15;
    (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = iVar7 + 1;
    uVar22 = uVar22 + 1;
  }
LAB_008b065c:
  if ((DVar8 & 1) != 0) {
    pLVar13 = this->pVarWalkers;
    pVVar15 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
    DVar8 = this->frameWalkerFlags;
    pVVar15->pFrame = this->pFrame;
    pVVar15->instance = (Var)0x0;
    pVVar15->pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    *(undefined8 *)((long)&pVVar15->pMembersList + 5) = 0;
    pVVar15->allowSuperReference = (bool)((byte)DVar8 >> 3 & 1);
    (pVVar15->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
         (_func_int **)&PTR_Get_014e2db0;
    pVVar15[1].super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase = (_func_int **)0x0
    ;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar13,0);
    iVar7 = (pLVar13->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer[iVar7] = pVVar15;
    (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = iVar7 + 1;
  }
  iVar7 = (*this->pFrame->_vptr_DiagStackFrame[10])();
  if (uVar22 < uVar23) {
    pvVar17 = *(void **)(*(long *)(CONCAT44(extraout_var_04,iVar7) + 8) + 0x438);
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_78 = &PTR_Get_014e2e50;
    do {
      scope = FrameDisplay::GetItem(this_01,uVar22);
      if ((scope != (void *)0x0) && (scope != pvVar17)) {
        SVar12 = FrameDisplay::GetScopeType(scope);
        if (SVar12 == ScopeType_WithScope) {
          if ((this->frameWalkerFlags & 2) == 0) goto LAB_008b090b;
          this_03 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
          iVar7 = (*this->pFrame->_vptr_DiagStackFrame[10])();
          RecyclableObjectWalker::RecyclableObjectWalker
                    (this_03,(ScriptContext *)CONCAT44(extraout_var_05,iVar7),scope);
          pLVar13 = this->pVarWalkers;
          this_02 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
          DiagScopeVariablesWalker::DiagScopeVariablesWalker
                    (this_02,this->pFrame,scope,(IDiagObjectModelWalkerBase *)this_03);
        }
        else {
          if (SVar12 == ScopeType_SlotArray) {
            pLVar13 = this->pVarWalkers;
            this_02 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
            bVar1 = (byte)this->frameWalkerFlags;
            (this_02->super_VariableWalkerBase).pFrame = this->pFrame;
            (this_02->super_VariableWalkerBase).instance = scope;
            (this_02->super_VariableWalkerBase).pMembersList =
                 (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0;
            (this_02->super_VariableWalkerBase).groupType = UIGroupType_Scope;
            (this_02->super_VariableWalkerBase).allowLexicalThis = (bool)(bVar1 >> 2 & 1);
            (this_02->super_VariableWalkerBase).allowSuperReference = (bool)(bVar1 >> 3 & 1);
            ppuVar20 = &PTR_Get_014e2e00;
          }
          else {
            if (SVar12 != ScopeType_ActivationObject) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar18 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                          ,0x499,"(false)","false");
              if (bVar6) {
                *puVar18 = 0;
                goto LAB_008b090b;
              }
              goto LAB_008b09a8;
            }
            pLVar13 = this->pVarWalkers;
            this_02 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
            bVar1 = (byte)this->frameWalkerFlags;
            (this_02->super_VariableWalkerBase).pFrame = this->pFrame;
            (this_02->super_VariableWalkerBase).instance = scope;
            (this_02->super_VariableWalkerBase).pMembersList =
                 (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0;
            (this_02->super_VariableWalkerBase).groupType = UIGroupType_Scope;
            (this_02->super_VariableWalkerBase).allowLexicalThis = (bool)(bVar1 >> 2 & 1);
            (this_02->super_VariableWalkerBase).allowSuperReference = (bool)(bVar1 >> 3 & 1);
            ppuVar20 = local_78;
          }
          (this_02->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
          _vptr_IDiagObjectModelWalkerBase = (_func_int **)ppuVar20;
        }
        JsUtil::
        List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pLVar13,0);
        iVar7 = (pLVar13->
                super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        (pLVar13->
        super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
        buffer[iVar7] = &this_02->super_VariableWalkerBase;
        (pLVar13->
        super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).count
             = iVar7 + 1;
      }
LAB_008b090b:
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
  }
  if ((bVar21 & 1) == 0 && bVar5 == 0) {
    pLVar13 = this->pVarWalkers;
    pVVar15 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
    pDVar3 = this->pFrame;
    iVar7 = (*pDVar3->_vptr_DiagStackFrame[0x11])(pDVar3);
    pVVar15->pFrame = pDVar3;
    pVVar15->instance = (Var)CONCAT44(extraout_var_06,iVar7);
    pVVar15->pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    pVVar15->groupType = UIGroupType_Globals;
    pVVar15->allowLexicalThis = false;
    pVVar15->allowSuperReference = false;
    (pVVar15->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
         (_func_int **)&PTR_Get_014e2ea0;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar13,0);
    iVar7 = (pLVar13->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer[iVar7] = pVVar15;
    (pLVar13->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = iVar7 + 1;
  }
  return;
}

Assistant:

LocalsWalker::LocalsWalker(DiagStackFrame* _frame, DWORD _frameWalkerFlags)
        :  pFrame(_frame), frameWalkerFlags(_frameWalkerFlags), pVarWalkers(nullptr), totalLocalsCount(0), hasUserNotDefinedArguments(false)
    {
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();
        if (pFBody && !pFBody->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            // Allocate the container of all walkers.
            ArenaAllocator *arena = pFrame->GetArena();
            pVarWalkers = JsUtil::List<VariableWalkerBase *, ArenaAllocator>::New(arena);

            // Top most function will have one of these regslot, slotarray or activation object.

            FrameDisplay * pDisplay = pFrame->GetFrameDisplay();
            uint scopeCount = (uint)(pDisplay ? pDisplay->GetLength() : 0);

            uint nextStartIndex = 0;

            // Add the catch/with/block expression scope objects.
            if (pFBody->GetScopeObjectChain())
            {
                pVarWalkers->Add(Anew(arena, DiagScopeVariablesWalker, pFrame, nullptr, !!(frameWalkerFlags & FrameWalkerFlags::FW_EnumWithScopeAlso)));
            }

            // In the eval function, we will not show global items directly, instead they should go as a group node.
            bool shouldAddGlobalItemsDirectly = pFBody->GetIsGlobalFunc() && !pFBody->IsEval();
            bool dontAddGlobalsDirectly = (frameWalkerFlags & FrameWalkerFlags::FW_DontAddGlobalsDirectly) == FrameWalkerFlags::FW_DontAddGlobalsDirectly;
            if (shouldAddGlobalItemsDirectly && !dontAddGlobalsDirectly)
            {
                // Global properties will be enumerated using RootObjectVariablesWalker
                pVarWalkers->Add(Anew(arena, RootObjectVariablesWalker, pFrame, pFrame->GetRootObject(), UIGroupType_None));
            }

            DebuggerScope *formalScope = GetScopeWhenHaltAtFormals(pFrame);
            DWORD localsType = GetCurrentFramesLocalsType(pFrame);

            // If we are in the formal scope of a split scoped function then we can skip checking the body scope
            if (!VariableWalkerBase::IsInParamScope(formalScope, pFrame) || pFBody->IsParamAndBodyScopeMerged())
            {
                VariableWalkerBase *pVarWalker = nullptr;

                // More than one localsType can occur in the scope
                if (localsType & FramesLocalType::LocalType_InObject)
                {
                    Assert(scopeCount > 0);
                    pVarWalker = Anew(arena, ObjectVariablesWalker, pFrame, pDisplay->GetItem(nextStartIndex), UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference));
                    nextStartIndex++;
                }
                else if (localsType & FramesLocalType::LocalType_InSlot)
                {
                    Assert(scopeCount > 0);
                    pVarWalker = Anew(arena, SlotArrayVariablesWalker, pFrame, (Js::Var *)pDisplay->GetItem(nextStartIndex), UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference));
                    nextStartIndex++;
                }
                else if (scopeCount > 0 && pFBody->GetFrameDisplayRegister() != 0 && pFBody->IsParamAndBodyScopeMerged())
                {
                    Assert((Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull());
                    nextStartIndex++;
                }

                if (pVarWalker)
                {
                    pVarWalkers->Add(pVarWalker);
                }
            }

            // If we are halted at formal place, and param and body scopes are splitted we need to make use of formal debugger scope to to determine the locals type.
            if (formalScope != nullptr && !pFBody->IsParamAndBodyScopeMerged())
            {
                if (pFBody->GetPropertyIdOnRegSlotsContainer() && pFBody->GetPropertyIdOnRegSlotsContainer()->formalsUpperBound != Js::Constants::NoRegister)
                {
                    localsType |= FramesLocalType::LocalType_Reg;
                }

                Assert(scopeCount > 0);
                if (formalScope->scopeType == Js::DiagParamScopeInObject)
                {
                    // Need to add the param scope frame display as a separate walker as the ObjectVariablesWalker directly uses the socpe object to retrieve properties
                    pVarWalkers->Add(Anew(arena, ObjectVariablesWalker, pFrame, pDisplay->GetItem(nextStartIndex), UIGroupType_Param, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                }
                else
                {
                    pVarWalkers->Add(Anew(arena, SlotArrayVariablesWalker, pFrame, (Js::Var *)pDisplay->GetItem(nextStartIndex), UIGroupType_Param, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                }
                nextStartIndex++;
            }

            if (localsType & FramesLocalType::LocalType_Reg)
            {
                pVarWalkers->Add(Anew(arena, RegSlotVariablesWalker, pFrame, nullptr /*not debugger scope*/, UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
            }

            const Js::Var nullVar = pFrame->GetScriptContext()->GetLibrary()->GetNull();
            for (uint i = nextStartIndex; i < (uint)scopeCount; i++)
            {
                Var currentScopeObject = pDisplay->GetItem(i);
                if (currentScopeObject != nullptr && currentScopeObject != nullVar) // Skip nullptr (dummy scope)
                {
                    ScopeType scopeType = FrameDisplay::GetScopeType(currentScopeObject);
                    switch(scopeType)
                    {
                    case ScopeType_ActivationObject:
                        pVarWalkers->Add(Anew(arena, ObjectVariablesWalker, pFrame, currentScopeObject, UIGroupType_Scope, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                        break;
                    case ScopeType_SlotArray:
                        pVarWalkers->Add(Anew(arena, SlotArrayVariablesWalker, pFrame, currentScopeObject, UIGroupType_Scope, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                        break;
                    case ScopeType_WithScope:
                        if( (frameWalkerFlags & FrameWalkerFlags::FW_EnumWithScopeAlso) == FrameWalkerFlags::FW_EnumWithScopeAlso)
                        {
                            RecyclableObjectWalker* withScopeWalker = Anew(arena, RecyclableObjectWalker, pFrame->GetScriptContext(), currentScopeObject);
                            pVarWalkers->Add(Anew(arena, DiagScopeVariablesWalker, pFrame, currentScopeObject, withScopeWalker));
                        }
                        break;
                    default:
                        Assert(false);
                    }
                }
            }

            // No need to add global properties if this is a global function, as it is already done above.
            if (!shouldAddGlobalItemsDirectly && !dontAddGlobalsDirectly)
            {
                pVarWalkers->Add(Anew(arena, RootObjectVariablesWalker, pFrame, pFrame->GetRootObject(),  UIGroupType_Globals));
            }
        }
    }